

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Tbc::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  char cVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  undefined3 uVar6;
  size_type sVar7;
  TextAttributes *pTVar8;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  ulong _pos;
  string remainder;
  string wrappableChars;
  size_t local_100;
  string local_f8;
  TextAttributes *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b0;
  Text *local_a8;
  long local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = &(this->str).field_2;
  (this->str)._M_dataplus._M_p = (pointer)local_98;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  sVar10 = _attr->indent;
  sVar5 = _attr->width;
  uVar3 = *(undefined4 *)((long)&_attr->width + 4);
  cVar1 = _attr->tabChar;
  uVar6 = *(undefined3 *)&_attr->field_0x19;
  uVar4 = *(undefined4 *)&_attr->field_0x1c;
  (this->attr).initialIndent = _attr->initialIndent;
  (this->attr).indent = sVar10;
  *(int *)&(this->attr).width = (int)sVar5;
  *(undefined4 *)((long)&(this->attr).width + 4) = uVar3;
  (this->attr).tabChar = cVar1;
  *(undefined3 *)&(this->attr).field_0x19 = uVar6;
  *(undefined4 *)&(this->attr).field_0x1c = uVar4;
  local_b0 = &this->lines;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90[0] = local_80;
  local_a8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90," [({.,/|\\-","");
  local_100 = _attr->initialIndent;
  if (local_100 == 0xffffffffffffffff) {
    local_100 = _attr->indent;
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  pcVar2 = (_str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar2,pcVar2 + _str->_M_string_length);
  if (local_f8._M_string_length != 0) {
    local_d8 = _attr;
    do {
      sVar7 = local_f8._M_string_length;
      if (0x7ce0 < (ulong)((long)(this->lines).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->lines).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"... message truncated due to excessive size","");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_b0,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        break;
      }
      sVar10 = local_d8->width;
      uVar9 = std::__cxx11::string::find((char)&local_f8,10);
      _pos = sVar10 - local_100;
      if (sVar7 <= _pos) {
        _pos = sVar7;
      }
      if (uVar9 < _pos) {
        _pos = uVar9;
      }
      local_a0 = std::__cxx11::string::rfind((char)&local_f8,(ulong)(uint)(int)local_d8->tabChar);
      if (local_a0 != -1) {
        cVar1 = local_f8._M_dataplus._M_p[_pos];
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_f8);
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_f8);
        std::operator+(&local_d0,&local_70,&local_50);
        std::__cxx11::string::_M_assign((string *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        _pos = _pos - (cVar1 == '\n');
        this = local_a8;
      }
      if (_pos == local_f8._M_string_length) {
        spliceLine(this,local_100,&local_f8,_pos);
      }
      else if (local_f8._M_dataplus._M_p[_pos] == '\n') {
        spliceLine(this,local_100,&local_f8,_pos);
        pTVar8 = local_d8;
        if ((_pos < 2) || (local_f8._M_string_length != 1)) {
          std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_f8);
          std::__cxx11::string::_M_assign((string *)&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
        }
        local_100 = pTVar8->indent;
      }
      else {
        sVar10 = std::__cxx11::string::find_last_of((char *)&local_f8,(ulong)local_90[0],_pos);
        if (sVar10 - 1 < 0xfffffffffffffffe) {
          spliceLine(this,local_100,&local_f8,sVar10);
          if (*local_f8._M_dataplus._M_p == ' ') {
            std::__cxx11::string::substr((ulong)&local_d0,(ulong)&local_f8);
            std::__cxx11::string::_M_assign((string *)&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
          }
        }
        else {
          spliceLine(this,local_100,&local_f8,_pos - 1);
          std::__cxx11::string::append
                    ((char *)((this->lines).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1));
        }
        if ((long)(this->lines).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->lines).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x20) {
          local_100 = local_d8->indent;
        }
        lVar11 = 0;
        if (local_a0 != -1) {
          lVar11 = local_a0;
        }
        local_100 = local_100 + lVar11;
      }
    } while (local_f8._M_string_length != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  return;
}

Assistant:

Text( std::string const& _str, TextAttributes const& _attr = TextAttributes() )
        : attr( _attr )
        {
            std::string wrappableChars = " [({.,/|\\-";
            std::size_t indent = _attr.initialIndent != std::string::npos
                ? _attr.initialIndent
                : _attr.indent;
            std::string remainder = _str;

            while( !remainder.empty() ) {
                if( lines.size() >= 1000 ) {
                    lines.push_back( "... message truncated due to excessive size" );
                    return;
                }
                std::size_t tabPos = std::string::npos;
                std::size_t width = (std::min)( remainder.size(), _attr.width - indent );
                std::size_t pos = remainder.find_first_of( '\n' );
                if( pos <= width ) {
                    width = pos;
                }
                pos = remainder.find_last_of( _attr.tabChar, width );
                if( pos != std::string::npos ) {
                    tabPos = pos;
                    if( remainder[width] == '\n' )
                        width--;
                    remainder = remainder.substr( 0, tabPos ) + remainder.substr( tabPos+1 );
                }

                if( width == remainder.size() ) {
                    spliceLine( indent, remainder, width );
                }
                else if( remainder[width] == '\n' ) {
                    spliceLine( indent, remainder, width );
                    if( width <= 1 || remainder.size() != 1 )
                        remainder = remainder.substr( 1 );
                    indent = _attr.indent;
                }
                else {
                    pos = remainder.find_last_of( wrappableChars, width );
                    if( pos != std::string::npos && pos > 0 ) {
                        spliceLine( indent, remainder, pos );
                        if( remainder[0] == ' ' )
                            remainder = remainder.substr( 1 );
                    }
                    else {
                        spliceLine( indent, remainder, width-1 );
                        lines.back() += "-";
                    }
                    if( lines.size() == 1 )
                        indent = _attr.indent;
                    if( tabPos != std::string::npos )
                        indent += tabPos;
                }
            }
        }